

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.h
# Opt level: O3

void __thiscall dh::trival::trival(trival *this,trival *param_1)

{
  pointer pcVar1;
  
  (this->_res).name._M_dataplus._M_p = (pointer)&(this->_res).name.field_2;
  pcVar1 = (param_1->_res).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (param_1->_res).name._M_string_length);
  (this->_res).type = (param_1->_res).type;
  (this->_operand)._M_dataplus._M_p = (pointer)&(this->_operand).field_2;
  pcVar1 = (param_1->_operand)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_operand,pcVar1,pcVar1 + (param_1->_operand)._M_string_length);
  (this->_val1).name._M_dataplus._M_p = (pointer)&(this->_val1).name.field_2;
  pcVar1 = (param_1->_val1).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_val1,pcVar1,pcVar1 + (param_1->_val1).name._M_string_length);
  (this->_val1).type = (param_1->_val1).type;
  (this->_val2).name._M_dataplus._M_p = (pointer)&(this->_val2).name.field_2;
  pcVar1 = (param_1->_val2).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_val2,pcVar1,pcVar1 + (param_1->_val2).name._M_string_length);
  (this->_val2).type = (param_1->_val2).type;
  this->size = param_1->size;
  return;
}

Assistant:

trival( ::std::string operand)
		{
			this->_operand = operand;
			size = 0;
		}